

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

RtAudioErrorType __thiscall RtApiAlsa::startStream(RtApiAlsa *this)

{
  RtAudioErrorType RVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_70 [32];
  string local_50 [32];
  snd_pcm_t **local_30;
  snd_pcm_t **handle;
  AlsaHandle *apiInfo;
  snd_pcm_state_t state;
  int result;
  RtApiAlsa *this_local;
  
  _state = this;
  if ((this->super_RtApi).stream_.state != STREAM_STOPPED) {
    if ((this->super_RtApi).stream_.state == STREAM_RUNNING) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_RtApi).errorText_,
                 "RtApiAlsa::startStream(): the stream is already running!");
    }
    else if (((this->super_RtApi).stream_.state == STREAM_STOPPING) ||
            ((this->super_RtApi).stream_.state == STREAM_CLOSED)) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_RtApi).errorText_,
                 "RtApiAlsa::startStream(): the stream is stopping or closed!");
    }
    RVar1 = RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
    return RVar1;
  }
  pthread_mutex_lock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
  apiInfo._4_4_ = 0;
  local_30 = (snd_pcm_t **)(this->super_RtApi).stream_.apiHandle;
  handle = local_30;
  if (((((this->super_RtApi).stream_.mode == OUTPUT) || ((this->super_RtApi).stream_.mode == DUPLEX)
       ) && (apiInfo._0_4_ = snd_pcm_state(*local_30), (int)apiInfo != 2)) &&
     (apiInfo._4_4_ = snd_pcm_prepare(*local_30), apiInfo._4_4_ < 0)) {
    poVar2 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                             "RtApiAlsa::startStream: error preparing output pcm device, ");
    pcVar3 = (char *)snd_strerror(apiInfo._4_4_);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,".");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,local_50);
    std::__cxx11::string::~string(local_50);
  }
  else {
    if ((((this->super_RtApi).stream_.mode == INPUT) || ((this->super_RtApi).stream_.mode == DUPLEX)
        ) && (((ulong)handle[2] & 1) == 0)) {
      apiInfo._4_4_ = snd_pcm_drop(local_30[1]);
      apiInfo._0_4_ = snd_pcm_state(local_30[1]);
      if (((int)apiInfo != 2) && (apiInfo._4_4_ = snd_pcm_prepare(local_30[1]), apiInfo._4_4_ < 0))
      {
        poVar2 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                                 "RtApiAlsa::startStream: error preparing input pcm device, ");
        pcVar3 = (char *)snd_strerror(apiInfo._4_4_);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::operator<<(poVar2,".");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,local_70);
        std::__cxx11::string::~string(local_70);
        goto LAB_00122947;
      }
    }
    (this->super_RtApi).stream_.state = STREAM_RUNNING;
  }
LAB_00122947:
  *(undefined1 *)(handle + 9) = 1;
  pthread_cond_signal((pthread_cond_t *)(handle + 3));
  pthread_mutex_unlock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
  if (apiInfo._4_4_ < 0) {
    this_local._4_4_ = RtApi::error(&this->super_RtApi,RTAUDIO_SYSTEM_ERROR);
  }
  else {
    this_local._4_4_ = RTAUDIO_NO_ERROR;
  }
  return this_local._4_4_;
}

Assistant:

RtAudioErrorType RtApiAlsa :: startStream()
{
  // This method calls snd_pcm_prepare if the device isn't already in that state.

  if ( stream_.state != STREAM_STOPPED ) {
    if ( stream_.state == STREAM_RUNNING )
      errorText_ = "RtApiAlsa::startStream(): the stream is already running!";
    else if ( stream_.state == STREAM_STOPPING || stream_.state == STREAM_CLOSED )
      errorText_ = "RtApiAlsa::startStream(): the stream is stopping or closed!";
    return error( RTAUDIO_WARNING );
  }

  MUTEX_LOCK( &stream_.mutex );

  /*
  #if defined( HAVE_GETTIMEOFDAY )
  gettimeofday( &stream_.lastTickTimestamp, NULL );
  #endif
  */
  
  int result = 0;
  snd_pcm_state_t state;
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  snd_pcm_t **handle = (snd_pcm_t **) apiInfo->handles;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    state = snd_pcm_state( handle[0] );
    if ( state != SND_PCM_STATE_PREPARED ) {
      result = snd_pcm_prepare( handle[0] );
      if ( result < 0 ) {
        errorStream_ << "RtApiAlsa::startStream: error preparing output pcm device, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
        goto unlock;
      }
    }
  }

  if ( ( stream_.mode == INPUT || stream_.mode == DUPLEX ) && !apiInfo->synchronized ) {
    result = snd_pcm_drop(handle[1]); // fix to remove stale data received since device has been open
    state = snd_pcm_state( handle[1] );
    if ( state != SND_PCM_STATE_PREPARED ) {
      result = snd_pcm_prepare( handle[1] );
      if ( result < 0 ) {
        errorStream_ << "RtApiAlsa::startStream: error preparing input pcm device, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
        goto unlock;
      }
    }
  }

  stream_.state = STREAM_RUNNING;

 unlock:
  apiInfo->runnable = true;
  pthread_cond_signal( &apiInfo->runnable_cv );
  MUTEX_UNLOCK( &stream_.mutex );

  if ( result < 0 ) return error( RTAUDIO_SYSTEM_ERROR );
  return RTAUDIO_NO_ERROR;
}